

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serv.cpp
# Opt level: O3

ICUServiceFactory * __thiscall
icu_63::ICUService::createSimpleFactory
          (ICUService *this,UObject *objToAdopt,UnicodeString *id,UBool visible,UErrorCode *status)

{
  SimpleFactory *this_00;
  
  if (*status < U_ILLEGAL_ARGUMENT_ERROR) {
    if ((objToAdopt == (UObject *)0x0) ||
       ((undefined1  [56])((undefined1  [56])id->fUnion & (undefined1  [56])0x1) !=
        (undefined1  [56])0x0)) {
      *status = U_ILLEGAL_ARGUMENT_ERROR;
    }
    else {
      this_00 = (SimpleFactory *)UMemory::operator_new((UMemory *)0x58,(size_t)objToAdopt);
      if (this_00 != (SimpleFactory *)0x0) {
        SimpleFactory::SimpleFactory(this_00,objToAdopt,id,visible);
        return &this_00->super_ICUServiceFactory;
      }
    }
  }
  return (ICUServiceFactory *)0x0;
}

Assistant:

UnicodeString& 
ICUService::getDisplayName(const UnicodeString& id, UnicodeString& result) const 
{
    return getDisplayName(id, result, Locale::getDefault());
}